

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O2

hugeint_t duckdb::Hugeint::DivMod(hugeint_t lhs,hugeint_t rhs,hugeint_t *remainder)

{
  ulong uVar1;
  hugeint_t hVar2;
  undefined1 auVar3 [16];
  duckdb *this;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  duckdb *this_00;
  int64_t extraout_RDX;
  duckdb *pdVar8;
  duckdb *pdVar9;
  int64_t value;
  duckdb *pdVar10;
  duckdb *pdVar11;
  ulong uVar12;
  ulong uVar13;
  hugeint_t hVar14;
  hugeint_t hVar15;
  hugeint_t n;
  hugeint_t local_88;
  hugeint_t result;
  hugeint_t local_60;
  hugeint_t rhs_local;
  
  uVar7 = rhs.upper;
  this_00 = (duckdb *)rhs.lower;
  pdVar9 = (duckdb *)lhs.upper;
  pdVar11 = (duckdb *)lhs.lower;
  rhs_local.lower = (uint64_t)this_00;
  rhs_local.upper = uVar7;
  hugeint_t::hugeint_t(&result,0);
  if (((duckdb *)result.lower == this_00) && (result.upper == uVar7)) {
    remainder->lower = (uint64_t)pdVar11;
    remainder->upper = (int64_t)pdVar9;
    hugeint_t::hugeint_t(&local_88,0);
    goto LAB_002811ae;
  }
  if (pdVar9 == (duckdb *)0x8000000000000000 && pdVar11 == (duckdb *)0x0) {
    if (uVar7 == 0x8000000000000000 && this_00 == (duckdb *)0x0) {
      hugeint_t::hugeint_t(&local_60,0);
      remainder->lower = local_60.lower;
      remainder->upper = local_60.upper;
      value = 1;
      goto LAB_002811a0;
    }
    hugeint_t::hugeint_t(&local_60,1);
    hVar15.upper = local_60.upper | 0x8000000000000000;
    hVar15.lower = local_60.lower;
    result = DivMod(hVar15,rhs,remainder);
    hVar14 = duckdb::Abs(result);
    hugeint_t::hugeint_t(&local_60,1);
    auVar3._8_8_ = local_60.upper;
    auVar3._0_8_ = local_60.lower;
    hVar15 = duckdb::Abs(result);
    n.upper = hVar15.upper;
    if (hVar15 == (hugeint_t)((undefined1  [16])hVar14 + auVar3)) {
      n.lower = uVar7;
      iVar5 = Sign(this_00,n);
      hugeint_t::hugeint_t(&local_60,(long)iVar5);
      hugeint_t::operator-=(&result,&local_60);
      hugeint_t::hugeint_t(&local_60,0);
      remainder->lower = local_60.lower;
      remainder->upper = local_60.upper;
    }
    else {
      hugeint_t::hugeint_t(&local_60,1);
      hugeint_t::operator-=(remainder,&local_60);
    }
  }
  else {
    if (uVar7 != 0x8000000000000000 || this_00 != (duckdb *)0x0) {
      pdVar8 = (duckdb *)(~(ulong)pdVar9 + (ulong)(pdVar11 == (duckdb *)0x0));
      this = (duckdb *)-(long)pdVar11;
      if (-1 < (long)pdVar9) {
        pdVar8 = pdVar9;
        this = pdVar11;
      }
      uVar13 = uVar7;
      if ((long)uVar7 < 0) {
        rhs_local.lower = -(long)this_00;
        rhs_local.upper = ~uVar7 + (ulong)(this_00 == (duckdb *)0x0);
        uVar13 = rhs_local.upper;
        this_00 = (duckdb *)rhs_local.lower;
      }
      local_88.lower = 0;
      local_88.upper = 0;
      hVar14.upper = extraout_RDX;
      hVar14.lower = (uint64_t)pdVar8;
      bVar4 = PositiveHugeintHighestBit(this,hVar14);
      remainder->lower = 0;
      remainder->upper = 0;
      for (uVar12 = (ulong)bVar4; uVar12 != 0; uVar12 = uVar12 - 1) {
        uVar1 = local_88.lower * 2;
        local_88.upper = local_88.upper << 1 | local_88.lower >> 0x3f;
        uVar6 = remainder->upper << 1 | remainder->lower >> 0x3f;
        pdVar11 = (duckdb *)(remainder->lower * 2);
        remainder->lower = (uint64_t)pdVar11;
        remainder->upper = uVar6;
        pdVar10 = pdVar8;
        if (uVar12 < 0x41) {
          pdVar10 = this;
        }
        local_88.lower = uVar1;
        if (((ulong)pdVar10 >> ((ulong)((int)uVar12 - 1U & 0xff) & 0x3f) & 1) != 0) {
          hugeint_t::hugeint_t(&result,1);
          hugeint_t::operator+=(remainder,&result);
          pdVar11 = (duckdb *)remainder->lower;
          uVar6 = remainder->upper;
        }
        if (((long)uVar13 < (long)uVar6) || (this_00 <= pdVar11 && uVar6 == uVar13)) {
          hugeint_t::operator-=(remainder,&rhs_local);
          hugeint_t::hugeint_t(&result,1);
          hugeint_t::operator+=(&local_88,&result);
        }
      }
      if ((long)(uVar7 ^ (ulong)pdVar9) < 0) {
        local_88.upper = ~local_88.upper + (ulong)(local_88.lower == 0);
        local_88.lower = -local_88.lower;
      }
      if ((long)pdVar9 < 0) {
        NegateInPlace<false>(remainder);
      }
      goto LAB_002811ae;
    }
    remainder->lower = (uint64_t)pdVar11;
    remainder->upper = (int64_t)pdVar9;
    value = 0;
LAB_002811a0:
    hugeint_t::hugeint_t(&result,value);
  }
  local_88.lower = result.lower;
  local_88.upper = result.upper;
LAB_002811ae:
  hVar2.upper = local_88.upper;
  hVar2.lower = local_88.lower;
  return hVar2;
}

Assistant:

hugeint_t Hugeint::DivMod(hugeint_t lhs, hugeint_t rhs, hugeint_t &remainder) {
	if (rhs == 0) {
		remainder = lhs;
		return hugeint_t(0);
	}

	// Check if one of the sides is hugeint_t minimum, as that can't be negated.
	if (lhs == NumericLimits<hugeint_t>::Minimum() || rhs == NumericLimits<hugeint_t>::Minimum()) {
		return DivModMinimum(lhs, rhs, remainder);
	}

	bool lhs_negative = lhs.upper < 0;
	bool rhs_negative = rhs.upper < 0;
	if (lhs_negative) {
		Hugeint::NegateInPlace<false>(lhs);
	}
	if (rhs_negative) {
		Hugeint::NegateInPlace<false>(rhs);
	}
	// DivMod code adapted from:
	// https://github.com/calccrypto/uint128_t/blob/master/uint128_t.cpp

	// initialize the result and remainder to 0
	hugeint_t div_result;
	div_result.lower = 0;
	div_result.upper = 0;
	remainder.lower = 0;
	remainder.upper = 0;

	uint8_t highest_bit_set = PositiveHugeintHighestBit(lhs);
	// now iterate over the amount of bits that are set in the LHS
	for (uint8_t x = highest_bit_set; x > 0; x--) {
		// left-shift the current result and remainder by 1
		div_result = PositiveHugeintLeftShift(div_result, 1);
		remainder = PositiveHugeintLeftShift(remainder, 1);

		// we get the value of the bit at position X, where position 0 is the least-significant bit
		if (PositiveHugeintIsBitSet(lhs, x - 1)) {
			remainder += 1;
		}
		if (Hugeint::GreaterThanEquals(remainder, rhs)) {
			// the remainder has passed the division multiplier: add one to the divide result
			remainder -= rhs;
			div_result += 1;
		}
	}
	if (lhs_negative ^ rhs_negative) {
		Hugeint::NegateInPlace<false>(div_result);
	}
	if (lhs_negative) {
		Hugeint::NegateInPlace<false>(remainder);
	}
	return div_result;
}